

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

istream * argo::operator>>(istream *stream,json *j)

{
  reader *local_20;
  
  parser::parse((parser *)&stack0xffffffffffffffe0,stream);
  json::operator=(j,(json *)local_20);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&stack0xffffffffffffffe0);
  return stream;
}

Assistant:

istream &NAMESPACE::operator>>(istream &stream, json &j)
{
    j = move(*parser::parse(stream));
    return stream;
}